

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

NumericData * __thiscall QLocaleData::numericData(QLocaleData *this,NumberMode mode)

{
  QStringView zero;
  QStringView zero_00;
  int iVar1;
  undefined4 extraout_var;
  QSystemLocale *str;
  qsizetype qVar3;
  int in_EDX;
  anon_class_8_1_ba1d7a2d *this_00;
  QLocaleData *in_RSI;
  void *pvVar4;
  NumericData *in_RDI;
  NumericData *pNVar5;
  long in_FS_OFFSET;
  QStringView QVar6;
  QStringView QVar7;
  QStringView QVar8;
  NumericData *result;
  anon_class_8_1_ba1d7a2d getString;
  QString *in_stack_fffffffffffffdd8;
  NumericData *in_stack_fffffffffffffde0;
  QString *this_01;
  NumericData *in_stack_fffffffffffffdf0;
  DataRange *in_stack_fffffffffffffdf8;
  storage_type_conflict *in_stack_fffffffffffffe00;
  storage_type_conflict *in_stack_fffffffffffffe08;
  qsizetype in_stack_fffffffffffffe18;
  qsizetype local_130;
  storage_type_conflict *local_128;
  qsizetype local_108;
  storage_type_conflict *local_100;
  qsizetype local_e0;
  storage_type_conflict *local_d8;
  qsizetype local_b8;
  storage_type_conflict *local_b0;
  undefined1 local_90 [24];
  storage_type_conflict *local_78;
  DataRange local_70;
  QStringView local_68;
  DataRange local_58;
  qsizetype local_50;
  storage_type_conflict *local_48;
  DataRange local_40;
  QStringView local_38;
  DataRange local_28;
  QStringView local_20;
  DataRange local_10;
  long local_8;
  qsizetype qVar2;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar4 = (void *)0xaa;
  memset(in_RDI,0xaa,0xb8);
  pNVar5 = in_RDI;
  NumericData::NumericData(in_stack_fffffffffffffde0);
  iVar1 = c(pNVar5,pvVar4);
  QVar6.m_data = local_48;
  QVar6.m_size = in_stack_fffffffffffffe18;
  if (in_RSI == (QLocaleData *)CONCAT44(extraout_var,iVar1)) {
    in_RDI->isC = true;
  }
  else {
    local_10 = QLocaleData::zero(in_RSI);
    DataRange::viewData(in_stack_fffffffffffffdf8,(char16_t *)in_stack_fffffffffffffdf0);
    zero.m_data = in_stack_fffffffffffffe08;
    zero.m_size = (qsizetype)in_stack_fffffffffffffe00;
    NumericData::setZero(in_stack_fffffffffffffdf0,zero);
    local_28 = groupDelim(in_RSI);
    local_20 = DataRange::viewData(in_stack_fffffffffffffdf8,(char16_t *)in_stack_fffffffffffffdf0);
    in_RDI->group = local_20;
    local_40 = minus(in_RSI);
    local_38 = DataRange::viewData(in_stack_fffffffffffffdf8,(char16_t *)in_stack_fffffffffffffdf0);
    this_00 = (anon_class_8_1_ba1d7a2d *)local_38.m_data;
    in_RDI->minus = local_38;
    local_58 = plus(in_RSI);
    QVar6 = DataRange::viewData(in_stack_fffffffffffffdf8,(char16_t *)in_stack_fffffffffffffdf0);
    QVar7.m_data = in_stack_fffffffffffffe00;
    QVar7.m_size = (qsizetype)in_stack_fffffffffffffe08;
    local_48 = QVar6.m_data;
    qVar2 = QVar6.m_size;
    in_RDI->plus = QVar6;
    local_50 = qVar2;
    if (in_EDX != 0) {
      local_70 = decimalSeparator(in_RSI);
      QVar7 = DataRange::viewData(in_stack_fffffffffffffdf8,(char16_t *)in_stack_fffffffffffffdf0);
      QVar6.m_data = local_48;
      QVar6.m_size = qVar2;
      in_RDI->decimal = QVar7;
      local_68 = QVar7;
    }
    QVar8.m_data = (storage_type_conflict *)in_stack_fffffffffffffdf0;
    QVar8.m_size = (qsizetype)in_stack_fffffffffffffdf8;
    local_48 = QVar6.m_data;
    qVar2 = QVar6.m_size;
    if (in_EDX == 2) {
      local_90._8_8_ = exponential(in_RSI);
      QVar8 = DataRange::viewData(in_stack_fffffffffffffdf8,(char16_t *)in_stack_fffffffffffffdf0);
      QVar6.m_data = local_48;
      QVar6.m_size = qVar2;
      in_RDI->exponent = QVar8;
      in_RDI->exponentCyrillic = in_RSI->m_script_id == 0x1b;
      unique0x10000f36 = QVar8;
    }
    local_48 = QVar6.m_data;
    qVar2 = QVar6.m_size;
    if (in_RSI == &systemLocaleData) {
      local_90._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      this_01 = (QString *)local_90;
      str = systemLocale();
      (this_01->d).d = (Data *)str;
      if (in_EDX != 0) {
        numericData::anon_class_8_1_ba1d7a2d::operator()(this_00,(QueryType)((ulong)qVar2 >> 0x20));
        QString::operator=(this_01,in_stack_fffffffffffffdd8);
        QString::~QString((QString *)0x4e4945);
        qVar3 = QString::size(&in_RDI->sysDecimal);
        if (qVar3 != 0) {
          QStringView::QStringView<QString,_true>((QStringView *)QVar8.m_data,(QString *)str);
          (in_RDI->decimal).m_size = local_b8;
          (in_RDI->decimal).m_data = local_b0;
        }
      }
      numericData::anon_class_8_1_ba1d7a2d::operator()(this_00,(QueryType)((ulong)qVar2 >> 0x20));
      QString::operator=(this_01,in_stack_fffffffffffffdd8);
      QString::~QString((QString *)0x4e49d1);
      qVar3 = QString::size(&in_RDI->sysGroup);
      if (qVar3 != 0) {
        QStringView::QStringView<QString,_true>((QStringView *)QVar8.m_data,(QString *)str);
        (in_RDI->group).m_size = local_e0;
        (in_RDI->group).m_data = local_d8;
      }
      numericData::anon_class_8_1_ba1d7a2d::operator()(this_00,(QueryType)((ulong)qVar2 >> 0x20));
      QString::operator=(this_01,in_stack_fffffffffffffdd8);
      QString::~QString((QString *)0x4e4a63);
      qVar3 = QString::size(&in_RDI->sysMinus);
      if (qVar3 != 0) {
        QStringView::QStringView<QString,_true>((QStringView *)QVar8.m_data,(QString *)str);
        (in_RDI->minus).m_size = local_108;
        (in_RDI->minus).m_data = local_100;
      }
      numericData::anon_class_8_1_ba1d7a2d::operator()(this_00,(QueryType)((ulong)qVar2 >> 0x20));
      QString::operator=(this_01,in_stack_fffffffffffffdd8);
      QString::~QString((QString *)0x4e4afb);
      qVar3 = QString::size(&in_RDI->sysPlus);
      if (qVar3 != 0) {
        QStringView::QStringView<QString,_true>((QStringView *)QVar8.m_data,(QString *)str);
        (in_RDI->plus).m_size = local_130;
        (in_RDI->plus).m_data = local_128;
      }
      numericData::anon_class_8_1_ba1d7a2d::operator()(this_00,(QueryType)((ulong)qVar2 >> 0x20));
      QStringView::QStringView<QString,_true>((QStringView *)QVar8.m_data,(QString *)str);
      zero_00.m_data = (storage_type_conflict *)QVar7.m_size;
      zero_00.m_size = (qsizetype)QVar7.m_data;
      NumericData::setZero((NumericData *)QVar8.m_data,zero_00);
      QString::~QString((QString *)0x4e4bae);
      QVar6.m_data = local_48;
      QVar6.m_size = qVar2;
    }
  }
  local_48 = QVar6.m_data;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline QLocaleData::NumericData QLocaleData::numericData(QLocaleData::NumberMode mode) const
{
    NumericData result;
    if (this == c()) {
        result.isC = true;
        return result;
    }
    result.setZero(zero().viewData(single_character_data));
    result.group = groupDelim().viewData(single_character_data);
    // Note: minus, plus and exponent might not actually be single characters.
    result.minus = minus().viewData(single_character_data);
    result.plus = plus().viewData(single_character_data);
    if (mode != IntegerMode)
        result.decimal = decimalSeparator().viewData(single_character_data);
    if (mode == DoubleScientificMode) {
        result.exponent = exponential().viewData(single_character_data);
        // exponentCyrillic means "apply the Cyrrilic-specific exponent hack"
        result.exponentCyrillic = m_script_id == QLocale::CyrillicScript;
    }
#ifndef QT_NO_SYSTEMLOCALE
    if (this == &systemLocaleData) {
        const auto getString = [sys = systemLocale()](QSystemLocale::QueryType query) {
            return sys->query(query).toString();
        };
        if (mode != IntegerMode) {
            result.sysDecimal = getString(QSystemLocale::DecimalPoint);
            if (result.sysDecimal.size())
                result.decimal = QStringView{result.sysDecimal};
        }
        result.sysGroup = getString(QSystemLocale::GroupSeparator);
        if (result.sysGroup.size())
            result.group = QStringView{result.sysGroup};
        result.sysMinus = getString(QSystemLocale::NegativeSign);
        if (result.sysMinus.size())
            result.minus = QStringView{result.sysMinus};
        result.sysPlus = getString(QSystemLocale::PositiveSign);
        if (result.sysPlus.size())
            result.plus = QStringView{result.sysPlus};
        result.setZero(getString(QSystemLocale::ZeroDigit));
    }
#endif

    return result;
}